

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O2

Polygon * __thiscall Polygon::ConvexHull(Polygon *__return_storage_ptr__,Polygon *this)

{
  float fVar1;
  float fVar2;
  const_iterator __begin1;
  _List_const_iterator<Point> _Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  const_iterator __end1;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  value_type local_2c;
  Point currentHullPoint;
  
  if ((this->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl._M_node._M_size < 3) {
    (__return_storage_ptr__->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl.
    _M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
    (__return_storage_ptr__->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl.
    _M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
    (__return_storage_ptr__->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl.
    _M_node._M_size = 0;
  }
  else {
    p_Var4 = (this->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl._M_node.
             super__List_node_base._M_next;
    fVar9 = *(float *)((long)(p_Var4 + 1) + 4);
    currentHullPoint.mX = *(float *)(p_Var4 + 1);
    for (; p_Var4 != (_List_node_base *)this;
        p_Var4 = (((list<Point,_std::allocator<Point>_> *)&p_Var4->_M_next)->
                 super__List_base<Point,_std::allocator<Point>_>)._M_impl._M_node.
                 super__List_node_base._M_next) {
      fVar8 = *(float *)&((list<Point,_std::allocator<Point>_> *)(p_Var4 + 1))->
                         super__List_base<Point,_std::allocator<Point>_>;
      fVar7 = fVar8;
      if (currentHullPoint.mX <= fVar8) {
        fVar7 = currentHullPoint.mX;
      }
      fVar9 = (float)(~-(uint)(fVar8 < currentHullPoint.mX) & (uint)fVar9 |
                     *(uint *)((long)(p_Var4 + 1) + 4) & -(uint)(fVar8 < currentHullPoint.mX));
      currentHullPoint.mX = fVar7;
    }
    (__return_storage_ptr__->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl.
    _M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
    (__return_storage_ptr__->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl.
    _M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
    (__return_storage_ptr__->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl.
    _M_node._M_size = 0;
    local_2c.mX = currentHullPoint.mX;
    local_2c.mY = fVar9;
    do {
      std::__cxx11::list<Point,_std::allocator<Point>_>::push_back
                (&__return_storage_ptr__->mPoints,&local_2c);
      _Var3 = std::
              __find_if<std::_List_const_iterator<Point>,__gnu_cxx::__ops::_Iter_equals_val<Point_const>>
                        ((this->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl.
                         _M_node.super__List_node_base._M_next,this,&local_2c);
      p_Var4 = (this->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl._M_node.
               super__List_node_base._M_next;
      p_Var5 = (_Var3._M_node)->_M_next;
      if ((_Var3._M_node)->_M_next == (_List_node_base *)this) {
        p_Var5 = p_Var4;
      }
      fVar8 = *(float *)&p_Var5[1]._M_next;
      fVar7 = *(float *)((long)&p_Var5[1]._M_next + 4);
      for (; p_Var4 != (_List_node_base *)this; p_Var4 = p_Var4->_M_next) {
        fVar1 = *(float *)&p_Var4[1]._M_next;
        fVar2 = *(float *)((long)&p_Var4[1]._M_next + 4);
        fVar10 = (fVar8 - fVar1) * (fVar2 - local_2c.mY) - (fVar7 - fVar2) * (fVar1 - local_2c.mX);
        if (0.0 <= fVar10) {
          fVar2 = fVar7;
        }
        fVar7 = fVar2;
        uVar6 = -(uint)(fVar10 < 0.0);
        fVar8 = (float)(~uVar6 & (uint)fVar8 | (uint)fVar1 & uVar6);
      }
      local_2c.mX = fVar8;
      local_2c.mY = fVar7;
    } while ((((fVar8 != currentHullPoint.mX) || (NAN(fVar8) || NAN(currentHullPoint.mX))) ||
             (fVar7 != fVar9)) || (NAN(fVar7) || NAN(fVar9)));
  }
  return __return_storage_ptr__;
}

Assistant:

Polygon Polygon::ConvexHull() const
{
    // Gift-wrapping algorithm
    if(mPoints.size() < 3)
    {
        return Polygon();
    }
    Point leftmostPoint = mPoints.front();
    for(auto point : mPoints)
    {
        if(point.IsOnTheLeftOf(leftmostPoint))
        {
            leftmostPoint = point;
        }
    }
    Polygon convexHull;
    Point currentHullPoint = leftmostPoint;
    do
    {
        Point nextHullPoint;
        convexHull.mPoints.push_back(currentHullPoint);
        auto NextHullPointIt = std::find(mPoints.begin(), mPoints.end(), currentHullPoint);
        NextHullPointIt++;
        if(NextHullPointIt != mPoints.end())
        {
            nextHullPoint = *(NextHullPointIt);
        }
        else
        {
            nextHullPoint = mPoints.front();
        }
        for(auto candidateHullPoint : mPoints)
        {
            if(candidateHullPoint.IsOnTheLeftOf(currentHullPoint, nextHullPoint))
            {
                nextHullPoint = candidateHullPoint;
            }
        }
        currentHullPoint = nextHullPoint;
    } while(currentHullPoint != leftmostPoint);
    return convexHull;
}